

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions.h
# Opt level: O0

void __thiscall QOpenGLFunctions::glStencilMask(QOpenGLFunctions *this,GLuint mask)

{
  undefined4 in_ESI;
  long *in_RDI;
  
  (**(code **)(*in_RDI + 0x130))(in_ESI);
  return;
}

Assistant:

inline void QOpenGLFunctions::glStencilMask(GLuint mask)
{
#if QT_CONFIG(opengles2) && defined(Q_OS_ANDROID)
    ::glStencilMask(mask);
#else
    Q_ASSERT(QOpenGLFunctions::isInitialized(d_ptr));
    d_ptr->f.StencilMask(mask);
#endif
    Q_OPENGL_FUNCTIONS_DEBUG
}